

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_test.cpp
# Opt level: O3

void __thiscall
environment_test_variable_path_sanitized_Test::TestBody
          (environment_test_variable_path_sanitized_Test *this)

{
  undefined8 *puVar1;
  int iVar2;
  AssertHelperData *__s1;
  char *pcVar3;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  internal local_28 [8];
  undefined8 *local_20;
  
  __s1 = (AssertHelperData *)environment_variable_path_create("ENV_SAN","default_path",0xd,0);
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.data_ = __s1;
  testing::internal::CmpHelperNE<char_const*,char_const*>
            (local_28,"(const char *)__null","(const char *)variable_path",(char **)&local_30,
             (char **)&local_38);
  puVar1 = local_20;
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/environment_test/source/environment_test.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
    if (local_20 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_20 != local_20 + 2) {
        operator_delete((undefined8 *)*local_20);
      }
      operator_delete(local_20);
    }
  }
  else {
    if (local_20 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_20 != local_20 + 2) {
        operator_delete((undefined8 *)*local_20);
      }
      operator_delete(puVar1);
    }
    local_30._M_head_impl = local_30._M_head_impl & 0xffffffff00000000;
    iVar2 = strcmp((char *)__s1,"abcd/");
    local_38.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_28,"(int)0","(int)strcmp(variable_path, \"abcd\" \"/\")",(int *)&local_30,
               (int *)&local_38);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (local_20 == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (char *)*local_20;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/environment_test/source/environment_test.cpp"
                 ,0x67,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_30._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_30._M_head_impl + 8))();
      }
    }
    if (local_20 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_20 != local_20 + 2) {
        operator_delete((undefined8 *)*local_20);
      }
      operator_delete(local_20);
    }
    environment_variable_path_destroy(__s1);
  }
  return;
}

Assistant:

TEST_F(environment_test, variable_path_sanitized)
{
	static const char variable_path_name[] = ENVIRONMENT_TEST_VARIABLE_PATH_SANITIZED;

	char *variable_path = environment_variable_path_create(variable_path_name, "default_path", sizeof("default_path"), NULL);

	ASSERT_NE((const char *)NULL, (const char *)variable_path);

	EXPECT_EQ((int)0, (int)strcmp(variable_path, "abcd" ENVIRONMENT_VARIABLE_PATH_SEPARATOR_STR));

	environment_variable_path_destroy(variable_path);
}